

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall
ast::Dir_byte::Dir_byte
          (Dir_byte *this,uint s,list<ast::Expression_*,_std::allocator<ast::Expression_*>_> *vl,
          Location left)

{
  uint section;
  long lVar1;
  uint size;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = left.unit;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_byte_0013b880;
  this->value_list = vl;
  this->grain_size = s;
  lVar1 = Sections::current_section;
  section = *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_index = section;
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar1 + 0x30);
  size = s * (int)(vl->super__List_base<ast::Expression_*,_std::allocator<ast::Expression_*>_>).
                  _M_impl._M_node._M_size;
  (this->super_Directive).super_Statement.size_in_memory = size;
  Sections::increase(section,size);
  return;
}

Assistant:

Dir_byte::Dir_byte(unsigned s, list<Expression*> *vl, Location left) :
	Directive {left}, value_list {vl}, grain_size {s}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = grain_size * value_list->size();
	Sections::increase(section_index, size_in_memory);
}